

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O2

void __thiscall
Tree::addDoubleIndirection
          (Tree *this,vector<record,_std::allocator<record>_> *key,Vertex **root,int weightPos)

{
  short sVar1;
  short sVar2;
  ostream *poVar3;
  Vertex *pVVar4;
  long lVar5;
  
  do {
    pVVar4 = *root;
    if (pVVar4 == (Vertex *)0x0) {
LAB_00103c45:
      pVVar4 = (Vertex *)operator_new(0x30);
      (pVVar4->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pVVar4->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pVVar4->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pVVar4->ptrRight = (Vertex *)0x0;
      *(undefined8 *)((long)&pVVar4->ptrRight + 4) = 0;
      *(undefined8 *)((long)&pVVar4->ptrLeft + 4) = 0;
      *root = pVVar4;
      std::vector<record,_std::allocator<record>_>::operator=
                ((vector<record,_std::allocator<record>_> *)pVVar4,key);
      (*root)->weight =
           (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[weightPos];
      return;
    }
    sVar1 = ((pVVar4->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
             super__Vector_impl_data._M_start)->year;
    sVar2 = ((key->super__Vector_base<record,_std::allocator<record>_>)._M_impl.
             super__Vector_impl_data._M_start)->year;
    lVar5 = 0x20;
    if ((sVar1 <= sVar2) && (lVar5 = 0x18, sVar2 <= sVar1)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Element is already in the array");
      std::endl<char,std::char_traits<char>>(poVar3);
      if (*root != (Vertex *)0x0) {
        return;
      }
      goto LAB_00103c45;
    }
    root = (Vertex **)
           ((long)&(pVVar4->data).super__Vector_base<record,_std::allocator<record>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar5);
  } while( true );
}

Assistant:

void addDoubleIndirection(vector<record> key, Vertex **root, int weightPos) {
        Vertex **head_ptr = root;
        while (*head_ptr) {
            if (key[0].year < (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrLeft);
            } else if (key[0].year > (*head_ptr)->data[0].year) {
                head_ptr = &((*head_ptr)->ptrRight);
            } else {
                cout << "Element is already in the array" << endl;
                break;
            }
        }
        if (*head_ptr == nullptr) {
            *head_ptr = new Vertex;
            (*head_ptr)->data = key;
            (*head_ptr)->weight = m_weightArray[weightPos];
        }
    }